

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<unsigned_int>::abstract_value(abstract_value<unsigned_int> *this)

{
  element_type *peVar1;
  abstract_value<unsigned_int> *this_local;
  
  Value::Value(&this->super_Value);
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_00186468;
  std::make_shared<unsigned_int>();
  peVar1 = std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->m_result).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
                     );
  this->m_store = peVar1;
  this->m_default = false;
  this->m_implicit = false;
  std::__cxx11::string::string((string *)&this->m_default_value);
  std::__cxx11::string::string((string *)&this->m_implicit_value);
  return;
}

Assistant:

abstract_value()
      : m_result(std::make_shared<T>())
      , m_store(m_result.get())
      {
      }